

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourceManager.cpp
# Opt level: O0

void __thiscall ResourceManager::ResourceManager(ResourceManager *this)

{
  ResourceBase *in_RDI;
  
  ResourceBase::ResourceBase(in_RDI);
  in_RDI->_vptr_ResourceBase = (_func_int **)&PTR__ResourceManager_0047e0b0;
  memset(in_RDI + 1,0,0x30);
  std::
  map<ghc::filesystem::path,_sf::Texture,_std::less<ghc::filesystem::path>,_std::allocator<std::pair<const_ghc::filesystem::path,_sf::Texture>_>_>
  ::map((map<ghc::filesystem::path,_sf::Texture,_std::less<ghc::filesystem::path>,_std::allocator<std::pair<const_ghc::filesystem::path,_sf::Texture>_>_>
         *)0x2031c8);
  memset(in_RDI + 7,0,0x30);
  std::
  map<ghc::filesystem::path,_sf::Font,_std::less<ghc::filesystem::path>,_std::allocator<std::pair<const_ghc::filesystem::path,_sf::Font>_>_>
  ::map((map<ghc::filesystem::path,_sf::Font,_std::less<ghc::filesystem::path>,_std::allocator<std::pair<const_ghc::filesystem::path,_sf::Font>_>_>
         *)0x2031ec);
  memset(in_RDI + 0xd,0,0x30);
  std::
  map<ghc::filesystem::path,_sf::Shader,_std::less<ghc::filesystem::path>,_std::allocator<std::pair<const_ghc::filesystem::path,_sf::Shader>_>_>
  ::map((map<ghc::filesystem::path,_sf::Shader,_std::less<ghc::filesystem::path>,_std::allocator<std::pair<const_ghc::filesystem::path,_sf::Shader>_>_>
         *)0x203210);
  return;
}

Assistant:

ResourceManager::ResourceManager() :
    textures_(),
    fonts_(),
    shaders_() {
}